

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O3

void __thiscall zstr::istreambuf::~istreambuf(istreambuf *this)

{
  char *pcVar1;
  
  *(undefined ***)this = &PTR__istreambuf_0069d1b8;
  std::
  unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>::
  ~unique_ptr(&this->zstrm_p);
  pcVar1 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  pcVar1 = (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  *(code **)this = sysconf;
  std::locale::~locale((locale *)&this->field_0x38);
  operator_delete(this,0x80);
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }